

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmir_optimization.cpp
# Opt level: O1

bool __thiscall
front::optimization::bmir_optimization::BmirOptimization::should_run_pass
          (BmirOptimization *this,string *pass_name)

{
  pointer pcVar1;
  bool bVar2;
  string pass;
  string local_38;
  
  pcVar1 = (pass_name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + pass_name->_M_string_length);
  bVar2 = should_run_pass(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool BmirOptimization::should_run_pass(std::string&& pass_name) {
  auto pass = pass_name;
  return should_run_pass(pass);
}